

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * GenImageWhiteNoise(Image *__return_storage_ptr__,int width,int height,float factor)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 uVar6;
  
  uVar1 = height * width;
  pvVar3 = malloc((long)(int)uVar1 * 4);
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = GetRandomValue(0,99);
    uVar6 = 0xffffffff;
    if ((int)(factor * 100.0) <= iVar2) {
      uVar6 = 0xff000000;
    }
    *(undefined4 *)((long)pvVar3 + uVar5 * 4) = uVar6;
  }
  __return_storage_ptr__->data = pvVar3;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageWhiteNoise(int width, int height, float factor)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int i = 0; i < width*height; i++)
    {
        if (GetRandomValue(0, 99) < (int)(factor*100.0f)) pixels[i] = WHITE;
        else pixels[i] = BLACK;
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}